

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

ngx_int_t ngx_create_path(ngx_file_t *file,ngx_path_t *path)

{
  int iVar1;
  int *piVar2;
  ulong local_38;
  ngx_uint_t i;
  size_t sStack_28;
  ngx_err_t err;
  size_t pos;
  ngx_path_t *path_local;
  ngx_file_t *file_local;
  
  sStack_28 = (path->name).len;
  for (local_38 = 0; (local_38 < 3 && (path->level[local_38] != 0)); local_38 = local_38 + 1) {
    sStack_28 = path->level[local_38] + 1 + sStack_28;
    (file->name).data[sStack_28] = '\0';
    if ((file->log->log_level & 0x10) != 0) {
      ngx_log_error_core(8,file->log,0,"temp file: \"%s\"",(file->name).data);
    }
    iVar1 = mkdir((char *)(file->name).data,0x1c0);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x11) {
        if (2 < file->log->log_level) {
          ngx_log_error_core(3,file->log,*piVar2,"mkdir() \"%s\" failed",(file->name).data);
        }
        return -1;
      }
    }
    (file->name).data[sStack_28] = '/';
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_create_path(ngx_file_t *file, ngx_path_t *path)
{
    size_t      pos;
    ngx_err_t   err;
    ngx_uint_t  i;

    pos = path->name.len;

    for (i = 0; i < NGX_MAX_PATH_LEVEL; i++) {
        if (path->level[i] == 0) {
            break;
        }

        pos += path->level[i] + 1;

        file->name.data[pos] = '\0';

        ngx_log_debug1(NGX_LOG_DEBUG_CORE, file->log, 0,
                       "temp file: \"%s\"", file->name.data);

        if (ngx_create_dir(file->name.data, 0700) == NGX_FILE_ERROR) {
            err = ngx_errno;
            if (err != NGX_EEXIST) {
                ngx_log_error(NGX_LOG_CRIT, file->log, err,
                              ngx_create_dir_n " \"%s\" failed",
                              file->name.data);
                return NGX_ERROR;
            }
        }

        file->name.data[pos] = '/';
    }

    return NGX_OK;
}